

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O0

void __thiscall helics::CoreBroker::processPriorityCommand(CoreBroker *this,ActionMessage *command)

{
  uint uVar1;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  string_view searchValue;
  string_view searchValue_00;
  basic_string_view<char,_std::char_traits<char>_> __x;
  string_view existingValue;
  string_view existingValue_00;
  string_view searchValue1;
  string_view searchValue1_00;
  string_view message_00;
  string_view message_01;
  string_view message_02;
  ActionMessage *pAVar2;
  bool bVar3;
  ConnectionState CVar4;
  __int_type_conflict1 _Var5;
  action_t aVar6;
  route_id rVar7;
  GlobalBrokerId GVar8;
  pointer pBVar9;
  pointer pBVar10;
  BasicFedInfo *pBVar11;
  pointer this_00;
  pointer pBVar12;
  BasicBrokerInfo *pBVar13;
  ActionMessage *in_RSI;
  CoreBroker *in_RDI;
  pair<std::__detail::_Node_iterator<std::pair<const_helics::GlobalFederateId,_helics::route_id>,_false,_false>,_bool>
  pVar14;
  optional<unsigned_long> oVar15;
  ActionMessage dis;
  BasicBrokerInfo *brk;
  route_id route_1;
  __normal_iterator<helics::BasicBrokerInfo_*,_std::vector<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>_>
  broker;
  ActionMessage fedEnableProfiling;
  route_id route;
  __normal_iterator<helics::BasicFedInfo_*,_std::vector<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>_>
  fed;
  ActionMessage *message;
  iterator __end4;
  iterator __begin4;
  vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_> *__range4;
  ActionMessage pngrep;
  ActionMessage *in_stack_fffffffffffff7e8;
  BrokerBase *in_stack_fffffffffffff7f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  TimeoutMonitor *in_stack_fffffffffffff7f8;
  TimeoutMonitor *in_stack_fffffffffffff800;
  undefined4 in_stack_fffffffffffff808;
  action_t in_stack_fffffffffffff80c;
  GlobalFederateId in_stack_fffffffffffff810;
  GlobalFederateId in_stack_fffffffffffff814;
  DualStringMappedVector<helics::BasicBrokerInfo,_helics::GlobalBrokerId,_(reference_stability)1,_5>
  *pDVar16;
  undefined4 in_stack_fffffffffffff818;
  GlobalBrokerId in_stack_fffffffffffff81c;
  char *in_stack_fffffffffffff820;
  GlobalFederateId *in_stack_fffffffffffff830;
  DualStringMappedVector<helics::BasicBrokerInfo,_helics::GlobalBrokerId,_(reference_stability)1,_5>
  *in_stack_fffffffffffff838;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffff840;
  GlobalBrokerId *this_02;
  GlobalFederateId *in_stack_fffffffffffff848;
  DualStringMappedVector<helics::BasicBrokerInfo,_helics::GlobalBrokerId,_(reference_stability)1,_5>
  *searchValue2;
  DualStringMappedVector<helics::BasicBrokerInfo,_helics::GlobalBrokerId,_(reference_stability)1,_5>
  *in_stack_fffffffffffff850;
  size_t in_stack_fffffffffffff858;
  undefined1 *puVar17;
  char *in_stack_fffffffffffff860;
  ActionMessage *in_stack_fffffffffffff878;
  CoreBroker *in_stack_fffffffffffff880;
  ActionMessage *in_stack_fffffffffffff8f8;
  CoreBroker *in_stack_fffffffffffff900;
  undefined1 in_stack_fffffffffffff94b;
  int in_stack_fffffffffffff94c;
  BrokerBase *in_stack_fffffffffffff950;
  string_view in_stack_fffffffffffff958;
  GlobalFederateId in_stack_fffffffffffff96c;
  CoreBroker *in_stack_fffffffffffff990;
  GlobalFederateId local_644;
  undefined1 local_640 [8];
  BaseType local_638;
  format_args in_stack_fffffffffffffa50;
  string_view in_stack_fffffffffffffa60;
  undefined1 in_stack_fffffffffffffa90;
  undefined1 in_stack_fffffffffffffa91 [11];
  undefined4 in_stack_fffffffffffffa9c;
  undefined1 in_stack_fffffffffffffab0;
  undefined7 in_stack_fffffffffffffab1;
  GlobalFederateId local_514;
  _Node_iterator_base<std::pair<const_helics::GlobalFederateId,_helics::route_id>,_false> local_510;
  undefined1 local_508;
  __sv_type local_500;
  BaseType local_4ec;
  uint local_4e8;
  BaseType local_4e4;
  __sv_type local_4d0;
  BaseType local_4bc;
  GlobalFederateId local_4b8;
  BaseType local_4b4;
  BasicBrokerInfo *local_4b0;
  string_view local_4a8;
  __normal_iterator<helics::BasicBrokerInfo_*,_std::vector<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>_>
  local_498;
  BaseType local_48c;
  BaseType local_488;
  BaseType local_484;
  GlobalFederateId local_480;
  BaseType local_47c;
  BaseType local_478;
  BaseType local_474;
  string_view local_470;
  char *local_460;
  undefined8 local_458;
  undefined1 local_450 [32];
  __sv_type local_430;
  __sv_type local_420;
  BaseType local_410;
  GlobalFederateId local_40c;
  __sv_type local_408;
  string_view local_3f8;
  BaseType local_3d8;
  BaseType local_3d4;
  _Storage<unsigned_long,_true> local_3d0;
  undefined1 local_3c8;
  string_view local_3c0;
  string_view local_3b0;
  uint local_3a0;
  BaseType local_39c;
  BaseType local_398;
  GlobalFederateId local_394;
  ActionMessage local_390;
  _Node_iterator_base<std::pair<const_helics::GlobalFederateId,_helics::route_id>,_false> local_2d8;
  undefined1 local_2d0;
  uint local_2c4;
  undefined1 in_stack_fffffffffffffd40 [16];
  __normal_iterator<helics::BasicFedInfo_*,_std::vector<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>_>
  local_290;
  reference local_288;
  ActionMessage *local_280;
  __normal_iterator<helics::ActionMessage_*,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>_>
  local_278;
  vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_> *local_270;
  BaseType local_264;
  GlobalFederateId local_260;
  BaseType local_25c;
  BaseType local_258;
  GlobalFederateId local_254;
  ActionMessage *in_stack_fffffffffffffdb0;
  undefined4 in_stack_fffffffffffffdb8;
  undefined4 in_stack_fffffffffffffdbc;
  BaseType local_184;
  undefined1 local_180 [32];
  char *local_160;
  undefined8 local_158;
  undefined1 local_150 [32];
  __sv_type local_130;
  __sv_type local_120;
  BaseType local_110;
  GlobalFederateId local_10c;
  ActionMessage *local_108;
  undefined1 local_f8 [16];
  BaseType local_e8 [4];
  undefined8 local_d8;
  undefined1 *local_d0;
  char *local_c8;
  undefined8 uStack_c0;
  BaseType *local_b0;
  undefined1 *local_a8;
  char *local_a0;
  undefined8 uStack_98;
  undefined1 *local_90;
  undefined1 local_88 [16];
  undefined8 local_78;
  undefined1 *local_70;
  char *local_68;
  undefined8 uStack_60;
  string_view *local_50;
  char *local_48;
  undefined8 uStack_40;
  undefined1 *local_38;
  BaseType local_2c;
  BaseType *local_28;
  undefined1 *local_20;
  undefined8 *local_18;
  undefined1 *local_10;
  undefined8 *local_8;
  
  local_108 = in_RSI;
  _Var5 = std::__atomic_base::operator_cast_to_int((__atomic_base<int> *)in_stack_fffffffffffff7f8);
  if (0x17 < _Var5) {
    local_110 = (in_RDI->super_BrokerBase).global_broker_id_local.gid;
    GlobalFederateId::GlobalFederateId(&local_10c,(GlobalBrokerId)local_110);
    getIdentifier_abi_cxx11_(in_RDI);
    local_120 = std::__cxx11::string::operator_cast_to_basic_string_view
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffff7f0);
    local_160 = "|| priority_cmd:{} from {}";
    local_158 = 0x1a;
    prettyPrintString_abi_cxx11_
              ((ActionMessage *)CONCAT71(in_stack_fffffffffffffab1,in_stack_fffffffffffffab0));
    local_184 = GlobalFederateId::baseValue(&local_108->source_id);
    local_90 = local_150;
    local_a0 = local_160;
    uStack_98 = local_158;
    local_a8 = local_180;
    local_b0 = &local_184;
    local_c8 = local_160;
    uStack_c0 = local_158;
    ::fmt::v11::detail::value<fmt::v11::context>::
    value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_0>
              ((value<fmt::v11::context> *)in_stack_fffffffffffff800,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff7f8);
    local_28 = local_e8;
    local_2c = *local_b0;
    local_18 = &local_d8;
    local_20 = local_f8;
    local_d8 = 0x1d;
    local_e8[0] = local_2c;
    local_d0 = local_20;
    ::fmt::v11::vformat_abi_cxx11_(in_stack_fffffffffffffa60,in_stack_fffffffffffffa50);
    local_130 = std::__cxx11::string::operator_cast_to_basic_string_view
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffff7f0);
    message_00._1_11_ = in_stack_fffffffffffffa91;
    message_00._M_len._0_1_ = in_stack_fffffffffffffa90;
    message_00._M_str._4_4_ = in_stack_fffffffffffffa9c;
    in_stack_fffffffffffff7e8 = (ActionMessage *)local_130._M_len;
    in_stack_fffffffffffff7f0 = (BrokerBase *)local_130._M_str;
    BrokerBase::sendToLogger
              (in_stack_fffffffffffff950,in_stack_fffffffffffff96c,in_stack_fffffffffffff94c,
               in_stack_fffffffffffff958,message_00,(bool)in_stack_fffffffffffff94b);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff7f0);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff7f0);
  }
  aVar6 = ActionMessage::action(local_108);
  if (aVar6 != cmd_set_global) {
    if (aVar6 == cmd_reg_broker) {
      brokerRegistration((CoreBroker *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8)
                         ,in_stack_fffffffffffffdb0);
      return;
    }
    if (1 < (uint)(aVar6 + ~(cmd_reg_broker|cmd_tick))) {
      if (aVar6 == cmd_ping_priority) {
        bVar3 = GlobalFederateId::operator==
                          (&local_108->dest_id,
                           (GlobalBrokerId)(in_RDI->super_BrokerBase).global_broker_id_local.gid);
        if (!bVar3) {
          routeMessage((CoreBroker *)
                       CONCAT44(in_stack_fffffffffffff814.gid,in_stack_fffffffffffff810.gid),
                       (ActionMessage *)
                       CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808));
          return;
        }
        ActionMessage::ActionMessage
                  ((ActionMessage *)
                   CONCAT44(in_stack_fffffffffffff814.gid,in_stack_fffffffffffff810.gid),
                   in_stack_fffffffffffff80c);
        local_258 = (in_RDI->super_BrokerBase).global_broker_id_local.gid;
        GlobalFederateId::GlobalFederateId(&local_254,(GlobalBrokerId)local_258);
        routeMessage((CoreBroker *)
                     CONCAT44(in_stack_fffffffffffff814.gid,in_stack_fffffffffffff810.gid),
                     (ActionMessage *)CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808))
        ;
        ActionMessage::~ActionMessage((ActionMessage *)in_stack_fffffffffffff7f0);
        return;
      }
      if (aVar6 == cmd_reg_fed) {
        fedRegistration(in_stack_fffffffffffffd40._8_8_,in_stack_fffffffffffffd40._0_8_);
        return;
      }
      if (aVar6 == cmd_send_command) {
        processCommandInstruction(in_stack_fffffffffffff900,in_stack_fffffffffffff8f8);
        return;
      }
      if (aVar6 != cmd_broker_query) {
        if (aVar6 == cmd_broker_ack) {
          local_3f8 = ActionMessage::name((ActionMessage *)0x5f5069);
          local_408 = std::__cxx11::string::operator_cast_to_basic_string_view
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)in_stack_fffffffffffff7f0);
          __x._M_len._4_4_ = in_stack_fffffffffffff81c.gid;
          __x._M_len._0_4_ = in_stack_fffffffffffff818;
          __x._M_str = in_stack_fffffffffffff820;
          __y._M_len._4_4_ = in_stack_fffffffffffff80c;
          __y._M_len._0_4_ = in_stack_fffffffffffff808;
          __y._M_str._0_4_ = in_stack_fffffffffffff810.gid;
          __y._M_str._4_4_ = in_stack_fffffffffffff814.gid;
          bVar3 = std::operator==(__x,__y);
          if (bVar3) {
            bVar3 = checkActionFlag<helics::ActionMessage,helics::GeneralFlags>
                              (local_108,error_flag);
            if (bVar3) {
              local_410 = (in_RDI->super_BrokerBase).global_broker_id_local.gid;
              GlobalFederateId::GlobalFederateId(&local_40c,(GlobalBrokerId)local_410);
              local_420 = std::__cxx11::string::operator_cast_to_basic_string_view
                                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)in_stack_fffffffffffff7f0);
              local_460 = "unable to register broker {}";
              local_458 = 0x1c;
              local_470 = SmallBuffer::to_string((SmallBuffer *)0x5f5169);
              local_38 = local_450;
              local_48 = local_460;
              uStack_40 = local_458;
              local_50 = &local_470;
              local_68 = local_460;
              uStack_60 = local_458;
              puVar17 = local_88;
              ::fmt::v11::detail::value<fmt::v11::context>::
              value<std::basic_string_view<char,_std::char_traits<char>_>,_char,_0>
                        ((value<fmt::v11::context> *)in_stack_fffffffffffff800,
                         (basic_string_view<char,_std::char_traits<char>_> *)
                         in_stack_fffffffffffff7f8);
              local_8 = &local_78;
              local_78 = 0xd;
              local_10 = puVar17;
              local_70 = puVar17;
              ::fmt::v11::vformat_abi_cxx11_(in_stack_fffffffffffffa60,in_stack_fffffffffffffa50);
              local_430 = std::__cxx11::string::operator_cast_to_basic_string_view
                                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)in_stack_fffffffffffff7f0);
              message_01._1_11_ = in_stack_fffffffffffffa91;
              message_01._M_len._0_1_ = in_stack_fffffffffffffa90;
              message_01._M_str._4_4_ = in_stack_fffffffffffffa9c;
              this_01 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_430._M_str;
              BrokerBase::sendToLogger
                        (in_stack_fffffffffffff950,in_stack_fffffffffffff96c,
                         in_stack_fffffffffffff94c,in_stack_fffffffffffff958,message_01,
                         (bool)in_stack_fffffffffffff94b);
              std::__cxx11::string::~string(this_01);
              return;
            }
            local_474 = (BaseType)
                        GlobalFederateId::operator_cast_to_GlobalBrokerId
                                  ((GlobalFederateId *)in_stack_fffffffffffff7e8);
            (in_RDI->super_BrokerBase).global_broker_id_local.gid = local_474;
            local_478 = (in_RDI->super_BrokerBase).global_broker_id_local.gid;
            std::atomic<helics::GlobalBrokerId>::store
                      ((atomic<helics::GlobalBrokerId> *)&(in_RDI->super_BrokerBase).global_id,
                       (GlobalBrokerId)local_478,seq_cst);
            local_47c = (BaseType)
                        GlobalFederateId::operator_cast_to_GlobalBrokerId
                                  ((GlobalFederateId *)in_stack_fffffffffffff7e8);
            (in_RDI->super_BrokerBase).higher_broker_id.gid = local_47c;
            bVar3 = checkActionFlag<helics::ActionMessage,helics::ConnectionFlags>
                              (local_108,global_timing_flag);
            if (bVar3) {
              (in_RDI->super_BrokerBase).globalTime = true;
              bVar3 = checkActionFlag<helics::ActionMessage,helics::ConnectionFlags>
                                (local_108,async_timing_flag);
              if (bVar3) {
                (in_RDI->super_BrokerBase).asyncTime = true;
              }
            }
            pBVar9 = CLI::std::
                     unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                     ::operator->((unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                                   *)0x5f53bc);
            local_484 = (in_RDI->super_BrokerBase).global_broker_id_local.gid;
            GlobalFederateId::GlobalFederateId(&local_480,(GlobalBrokerId)local_484);
            BaseTimeCoordinator::setSourceId(pBVar9,local_480);
            transmitDelayedMessages(in_stack_fffffffffffff990);
            local_488 = (in_RDI->super_BrokerBase).global_broker_id_local.gid;
            gmlc::containers::
            DualStringMappedVector<helics::BasicBrokerInfo,helics::GlobalBrokerId,(reference_stability)1,5>
            ::apply<helics::CoreBroker::processPriorityCommand(helics::ActionMessage&&)::__0>
                      ((DualStringMappedVector<helics::BasicBrokerInfo,_helics::GlobalBrokerId,_(reference_stability)1,_5>
                        *)CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808),
                       (anon_class_4_1_9785f0a6)in_stack_fffffffffffff814.gid);
            std::unique_ptr<helics::TimeoutMonitor,_std::default_delete<helics::TimeoutMonitor>_>::
            operator->((unique_ptr<helics::TimeoutMonitor,_std::default_delete<helics::TimeoutMonitor>_>
                        *)0x5f5444);
            local_48c = (in_RDI->super_BrokerBase).higher_broker_id.gid;
            TimeoutMonitor::setParentId
                      (in_stack_fffffffffffff7f8,
                       (GlobalBrokerId)(BaseType)((ulong)in_stack_fffffffffffff800 >> 0x20));
            bVar3 = checkActionFlag<helics::ActionMessage,helics::ConnectionFlags>
                              (local_108,slow_responding_flag);
            if (bVar3) {
              this_00 = std::
                        unique_ptr<helics::TimeoutMonitor,_std::default_delete<helics::TimeoutMonitor>_>
                        ::operator->((unique_ptr<helics::TimeoutMonitor,_std::default_delete<helics::TimeoutMonitor>_>
                                      *)0x5f5491);
              TimeoutMonitor::disableParentPing(this_00,true);
            }
            std::unique_ptr<helics::TimeoutMonitor,_std::default_delete<helics::TimeoutMonitor>_>::
            operator->((unique_ptr<helics::TimeoutMonitor,_std::default_delete<helics::TimeoutMonitor>_>
                        *)0x5f54b2);
            TimeoutMonitor::reset(in_stack_fffffffffffff800);
            bVar3 = checkActionFlag<helics::ActionMessage,helics::ConnectionFlags>
                              (local_108,global_disconnect_flag);
            if (!bVar3) {
              return;
            }
            (in_RDI->super_BrokerBase).globalDisconnect = true;
            return;
          }
          searchValue2 = &in_RDI->mBrokers;
          local_4a8 = ActionMessage::name((ActionMessage *)0x5f5506);
          searchValue_00._M_len._4_4_ = in_stack_fffffffffffff814.gid;
          searchValue_00._M_len._0_4_ = in_stack_fffffffffffff810.gid;
          searchValue_00._M_str._0_4_ = in_stack_fffffffffffff818;
          searchValue_00._M_str._4_4_ = in_stack_fffffffffffff81c.gid;
          local_498 = gmlc::containers::
                      DualStringMappedVector<helics::BasicBrokerInfo,_helics::GlobalBrokerId,_(reference_stability)1,_5>
                      ::find((DualStringMappedVector<helics::BasicBrokerInfo,_helics::GlobalBrokerId,_(reference_stability)1,_5>
                              *)CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808),
                             searchValue_00);
          local_4b0 = (BasicBrokerInfo *)
                      gmlc::containers::
                      DualStringMappedVector<helics::BasicBrokerInfo,_helics::GlobalBrokerId,_(reference_stability)1,_5>
                      ::end((DualStringMappedVector<helics::BasicBrokerInfo,_helics::GlobalBrokerId,_(reference_stability)1,_5>
                             *)in_stack_fffffffffffff7e8);
          bVar3 = __gnu_cxx::
                  operator==<helics::BasicBrokerInfo_*,_const_helics::BasicBrokerInfo_*,_std::vector<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>_>
                            ((__normal_iterator<helics::BasicBrokerInfo_*,_std::vector<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>_>
                              *)in_stack_fffffffffffff7f0,
                             (__normal_iterator<const_helics::BasicBrokerInfo_*,_std::vector<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>_>
                              *)in_stack_fffffffffffff7e8);
          if (((bVar3 ^ 0xffU) & 1) == 0) {
            pDVar16 = &in_RDI->mBrokers;
            ActionMessage::name((ActionMessage *)0x5f57fe);
            GlobalFederateId::operator_cast_to_GlobalBrokerId
                      ((GlobalFederateId *)in_stack_fffffffffffff7e8);
            ActionMessage::name((ActionMessage *)0x5f5833);
            searchValue1_00._M_str = in_stack_fffffffffffff860;
            searchValue1_00._M_len = in_stack_fffffffffffff858;
            gmlc::containers::
            DualStringMappedVector<helics::BasicBrokerInfo,helics::GlobalBrokerId,(reference_stability)1,5>
            ::insert<std::basic_string_view<char,std::char_traits<char>>>
                      (in_stack_fffffffffffff850,searchValue1_00,(GlobalBrokerId *)searchValue2,
                       in_stack_fffffffffffff840);
            rVar7 = getRoute((CoreBroker *)
                             CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808),
                             (GlobalFederateId)(BaseType)pDVar16);
            pBVar13 = gmlc::containers::
                      DualStringMappedVector<helics::BasicBrokerInfo,_helics::GlobalBrokerId,_(reference_stability)1,_5>
                      ::back((DualStringMappedVector<helics::BasicBrokerInfo,_helics::GlobalBrokerId,_(reference_stability)1,_5>
                              *)0x5f58bd);
            (pBVar13->route).rid = rVar7.rid;
            GVar8 = GlobalFederateId::operator_cast_to_GlobalBrokerId
                              ((GlobalFederateId *)in_stack_fffffffffffff7e8);
            pBVar13 = gmlc::containers::
                      DualStringMappedVector<helics::BasicBrokerInfo,_helics::GlobalBrokerId,_(reference_stability)1,_5>
                      ::back((DualStringMappedVector<helics::BasicBrokerInfo,_helics::GlobalBrokerId,_(reference_stability)1,_5>
                              *)0x5f58f3);
            (pBVar13->global_id).gid = GVar8.gid;
            __gnu_cxx::
            __normal_iterator<helics::BasicBrokerInfo_*,_std::vector<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>_>
            ::operator->(&local_498);
            gmlc::containers::
            DualStringMappedVector<helics::BasicBrokerInfo,_helics::GlobalBrokerId,_(reference_stability)1,_5>
            ::back((DualStringMappedVector<helics::BasicBrokerInfo,_helics::GlobalBrokerId,_(reference_stability)1,_5>
                    *)0x5f593d);
            std::
            unordered_map<helics::GlobalFederateId,helics::route_id,std::hash<helics::GlobalFederateId>,std::equal_to<helics::GlobalFederateId>,std::allocator<std::pair<helics::GlobalFederateId_const,helics::route_id>>>
            ::emplace<helics::GlobalBrokerId&,helics::route_id&>
                      ((unordered_map<helics::GlobalFederateId,_helics::route_id,_std::hash<helics::GlobalFederateId>,_std::equal_to<helics::GlobalFederateId>,_std::allocator<std::pair<const_helics::GlobalFederateId,_helics::route_id>_>_>
                        *)in_stack_fffffffffffff800,(GlobalBrokerId *)in_stack_fffffffffffff7f8,
                       (route_id *)in_stack_fffffffffffff7f0);
            return;
          }
          pBVar12 = __gnu_cxx::
                    __normal_iterator<helics::BasicBrokerInfo_*,_std::vector<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>_>
                    ::operator->(&local_498);
          this_02 = &pBVar12->global_id;
          local_4b4 = (BaseType)
                      GlobalFederateId::operator_cast_to_GlobalBrokerId
                                ((GlobalFederateId *)in_stack_fffffffffffff7e8);
          bVar3 = GlobalBrokerId::operator==(this_02,(GlobalBrokerId)local_4b4);
          if (!bVar3) {
            local_4e4 = (BaseType)
                        GlobalFederateId::operator_cast_to_GlobalBrokerId
                                  ((GlobalFederateId *)in_stack_fffffffffffff7e8);
            pBVar12 = __gnu_cxx::
                      __normal_iterator<helics::BasicBrokerInfo_*,_std::vector<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>_>
                      ::operator->(&local_498);
            (pBVar12->global_id).gid = local_4e4;
            pBVar12 = __gnu_cxx::
                      __normal_iterator<helics::BasicBrokerInfo_*,_std::vector<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>_>
                      ::operator->(&local_498);
            local_4e8 = (pBVar12->route).rid;
            local_4ec = (BaseType)
                        GlobalFederateId::operator_cast_to_GlobalBrokerId
                                  ((GlobalFederateId *)in_stack_fffffffffffff7e8);
            __gnu_cxx::
            __normal_iterator<helics::BasicBrokerInfo_*,_std::vector<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>_>
            ::operator->(&local_498);
            local_500 = std::__cxx11::string::operator_cast_to_basic_string_view
                                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)in_stack_fffffffffffff7f0);
            existingValue_00._M_str = (char *)searchValue2;
            existingValue_00._M_len = (size_t)this_02;
            gmlc::containers::
            DualStringMappedVector<helics::BasicBrokerInfo,_helics::GlobalBrokerId,_(reference_stability)1,_5>
            ::addSearchTerm(in_stack_fffffffffffff838,(GlobalBrokerId *)in_stack_fffffffffffff830,
                            existingValue_00);
            __gnu_cxx::
            __normal_iterator<helics::BasicBrokerInfo_*,_std::vector<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>_>
            ::operator->(&local_498);
            pVar14 = std::
                     unordered_map<helics::GlobalFederateId,helics::route_id,std::hash<helics::GlobalFederateId>,std::equal_to<helics::GlobalFederateId>,std::allocator<std::pair<helics::GlobalFederateId_const,helics::route_id>>>
                     ::emplace<helics::GlobalBrokerId&,helics::route_id&>
                               ((unordered_map<helics::GlobalFederateId,_helics::route_id,_std::hash<helics::GlobalFederateId>,_std::equal_to<helics::GlobalFederateId>,_std::allocator<std::pair<const_helics::GlobalFederateId,_helics::route_id>_>_>
                                 *)in_stack_fffffffffffff800,
                                (GlobalBrokerId *)in_stack_fffffffffffff7f8,
                                (route_id *)in_stack_fffffffffffff7f0);
            local_510._M_cur =
                 (__node_type *)
                 pVar14.first.
                 super__Node_iterator_base<std::pair<const_helics::GlobalFederateId,_helics::route_id>,_false>
                 ._M_cur;
            local_508 = pVar14.second;
            GlobalFederateId::GlobalFederateId
                      (&local_514,
                       (GlobalBrokerId)(in_RDI->super_BrokerBase).global_broker_id_local.gid);
            (local_108->source_id).gid = local_514.gid;
            (*(in_RDI->super_Broker)._vptr_Broker[0x22])(in_RDI,(ulong)local_4e8,local_108);
            return;
          }
          local_4bc = (in_RDI->super_BrokerBase).global_broker_id_local.gid;
          GlobalFederateId::GlobalFederateId(&local_4b8,(GlobalBrokerId)local_4bc);
          local_4d0 = std::__cxx11::string::operator_cast_to_basic_string_view
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)in_stack_fffffffffffff7f0);
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff800,
                     (char *)in_stack_fffffffffffff7f8);
          message_02._1_11_ = in_stack_fffffffffffffa91;
          message_02._M_len._0_1_ = in_stack_fffffffffffffa90;
          message_02._M_str._4_4_ = in_stack_fffffffffffffa9c;
          BrokerBase::sendToLogger
                    (in_stack_fffffffffffff950,in_stack_fffffffffffff96c,in_stack_fffffffffffff94c,
                     in_stack_fffffffffffff958,message_02,(bool)in_stack_fffffffffffff94b);
          return;
        }
        if (aVar6 == cmd_fed_ack) {
          ActionMessage::name((ActionMessage *)0x5f4c09);
          searchValue._M_len._4_4_ = in_stack_fffffffffffff814.gid;
          searchValue._M_len._0_4_ = in_stack_fffffffffffff810.gid;
          searchValue._M_str._0_4_ = in_stack_fffffffffffff818;
          searchValue._M_str._4_4_ = in_stack_fffffffffffff81c.gid;
          local_290 = gmlc::containers::
                      DualStringMappedVector<helics::BasicFedInfo,_helics::GlobalFederateId,_(reference_stability)1,_5>
                      ::find((DualStringMappedVector<helics::BasicFedInfo,_helics::GlobalFederateId,_(reference_stability)1,_5>
                              *)CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808),
                             searchValue);
          gmlc::containers::
          DualStringMappedVector<helics::BasicFedInfo,_helics::GlobalFederateId,_(reference_stability)1,_5>
          ::end((DualStringMappedVector<helics::BasicFedInfo,_helics::GlobalFederateId,_(reference_stability)1,_5>
                 *)in_stack_fffffffffffff7e8);
          bVar3 = __gnu_cxx::
                  operator==<helics::BasicFedInfo_*,_const_helics::BasicFedInfo_*,_std::vector<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>_>
                            ((__normal_iterator<helics::BasicFedInfo_*,_std::vector<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>_>
                              *)in_stack_fffffffffffff7f0,
                             (__normal_iterator<const_helics::BasicFedInfo_*,_std::vector<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>_>
                              *)in_stack_fffffffffffff7e8);
          if (((bVar3 ^ 0xffU) & 1) == 0) {
            local_3b0 = ActionMessage::name((ActionMessage *)0x5f4eec);
            local_3c0 = ActionMessage::name((ActionMessage *)0x5f4f1d);
            searchValue1._M_str = in_stack_fffffffffffff860;
            searchValue1._M_len = in_stack_fffffffffffff858;
            oVar15 = gmlc::containers::
                     DualStringMappedVector<helics::BasicFedInfo,helics::GlobalFederateId,(reference_stability)1,5>
                     ::insert<std::basic_string_view<char,std::char_traits<char>>>
                               ((DualStringMappedVector<helics::BasicFedInfo,_helics::GlobalFederateId,_(reference_stability)1,_5>
                                 *)in_stack_fffffffffffff850,searchValue1,in_stack_fffffffffffff848,
                                in_stack_fffffffffffff840);
            local_3d0._M_value =
                 oVar15.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                 super__Optional_payload_base<unsigned_long>._M_payload;
            local_3c8 = oVar15.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                        super__Optional_payload_base<unsigned_long>._M_engaged;
            local_3d8 = (local_108->source_id).gid;
            local_3d4 = (BaseType)
                        getRoute((CoreBroker *)
                                 CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808),
                                 in_stack_fffffffffffff810);
            pBVar11 = gmlc::containers::
                      DualStringMappedVector<helics::BasicFedInfo,_helics::GlobalFederateId,_(reference_stability)1,_5>
                      ::back((DualStringMappedVector<helics::BasicFedInfo,_helics::GlobalFederateId,_(reference_stability)1,_5>
                              *)0x5f4faa);
            (pBVar11->route).rid = local_3d4;
            pBVar11 = gmlc::containers::
                      DualStringMappedVector<helics::BasicFedInfo,_helics::GlobalFederateId,_(reference_stability)1,_5>
                      ::back((DualStringMappedVector<helics::BasicFedInfo,_helics::GlobalFederateId,_(reference_stability)1,_5>
                              *)0x5f4fd8);
            (pBVar11->global_id).gid = (local_108->dest_id).gid;
            __gnu_cxx::
            __normal_iterator<helics::BasicFedInfo_*,_std::vector<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>_>
            ::operator->(&local_290);
            gmlc::containers::
            DualStringMappedVector<helics::BasicFedInfo,_helics::GlobalFederateId,_(reference_stability)1,_5>
            ::back((DualStringMappedVector<helics::BasicFedInfo,_helics::GlobalFederateId,_(reference_stability)1,_5>
                    *)0x5f502c);
            std::
            unordered_map<helics::GlobalFederateId,helics::route_id,std::hash<helics::GlobalFederateId>,std::equal_to<helics::GlobalFederateId>,std::allocator<std::pair<helics::GlobalFederateId_const,helics::route_id>>>
            ::emplace<helics::GlobalFederateId&,helics::route_id&>
                      ((unordered_map<helics::GlobalFederateId,_helics::route_id,_std::hash<helics::GlobalFederateId>,_std::equal_to<helics::GlobalFederateId>,_std::allocator<std::pair<const_helics::GlobalFederateId,_helics::route_id>_>_>
                        *)in_stack_fffffffffffff800,(GlobalFederateId *)in_stack_fffffffffffff7f8,
                       (route_id *)in_stack_fffffffffffff7f0);
            return;
          }
          pBVar10 = __gnu_cxx::
                    __normal_iterator<helics::BasicFedInfo_*,_std::vector<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>_>
                    ::operator->(&local_290);
          uVar1 = (pBVar10->route).rid;
          pBVar10 = __gnu_cxx::
                    __normal_iterator<helics::BasicFedInfo_*,_std::vector<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>_>
                    ::operator->(&local_290);
          bVar3 = GlobalFederateId::isValid(&pBVar10->global_id);
          pAVar2 = local_108;
          if (!bVar3) {
            pBVar10 = __gnu_cxx::
                      __normal_iterator<helics::BasicFedInfo_*,_std::vector<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>_>
                      ::operator->(&local_290);
            (pBVar10->global_id).gid = (pAVar2->dest_id).gid;
            __gnu_cxx::
            __normal_iterator<helics::BasicFedInfo_*,_std::vector<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>_>
            ::operator->(&local_290);
            std::__cxx11::string::operator_cast_to_basic_string_view
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff7f0);
            existingValue._M_str = (char *)in_stack_fffffffffffff848;
            existingValue._M_len = (size_t)in_stack_fffffffffffff840;
            gmlc::containers::
            DualStringMappedVector<helics::BasicFedInfo,_helics::GlobalFederateId,_(reference_stability)1,_5>
            ::addSearchTerm((DualStringMappedVector<helics::BasicFedInfo,_helics::GlobalFederateId,_(reference_stability)1,_5>
                             *)in_stack_fffffffffffff838,in_stack_fffffffffffff830,existingValue);
          }
          local_2c4 = uVar1;
          (*(in_RDI->super_Broker)._vptr_Broker[0x22])(in_RDI,(ulong)uVar1,local_108);
          __gnu_cxx::
          __normal_iterator<helics::BasicFedInfo_*,_std::vector<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>_>
          ::operator->(&local_290);
          pVar14 = std::
                   unordered_map<helics::GlobalFederateId,helics::route_id,std::hash<helics::GlobalFederateId>,std::equal_to<helics::GlobalFederateId>,std::allocator<std::pair<helics::GlobalFederateId_const,helics::route_id>>>
                   ::emplace<helics::GlobalFederateId&,helics::route_id&>
                             ((unordered_map<helics::GlobalFederateId,_helics::route_id,_std::hash<helics::GlobalFederateId>,_std::equal_to<helics::GlobalFederateId>,_std::allocator<std::pair<const_helics::GlobalFederateId,_helics::route_id>_>_>
                               *)in_stack_fffffffffffff800,
                              (GlobalFederateId *)in_stack_fffffffffffff7f8,
                              (route_id *)in_stack_fffffffffffff7f0);
          aVar6 = (action_t)((ulong)in_stack_fffffffffffff800 >> 0x20);
          local_2d8._M_cur =
               (__node_type *)
               pVar14.first.
               super__Node_iterator_base<std::pair<const_helics::GlobalFederateId,_helics::route_id>,_false>
               ._M_cur;
          local_2d0 = pVar14.second;
          if (((in_RDI->super_BrokerBase).enable_profiling & 1U) == 0) {
            return;
          }
          local_398 = (in_RDI->super_BrokerBase).global_broker_id_local.gid;
          GlobalFederateId::GlobalFederateId(&local_394,(GlobalBrokerId)local_398);
          local_39c = (local_108->dest_id).gid;
          ActionMessage::ActionMessage
                    ((ActionMessage *)CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808),
                     aVar6,in_stack_fffffffffffff814,in_stack_fffffffffffff810);
          setActionFlag<helics::ActionMessage,helics::GeneralFlags>(&local_390,indicator_flag);
          local_3a0 = uVar1;
          (*(in_RDI->super_Broker)._vptr_Broker[0x22])(in_RDI,(ulong)uVar1,&local_390);
          ActionMessage::~ActionMessage((ActionMessage *)in_stack_fffffffffffff7f0);
          return;
        }
        if (aVar6 == cmd_register_route) {
          return;
        }
        if (aVar6 != cmd_priority_disconnect) {
          if (aVar6 != cmd_broker_setup) {
            return;
          }
          local_25c = (BaseType)
                      CLI::std::atomic<helics::GlobalBrokerId>::load
                                (&(in_RDI->super_BrokerBase).global_id,seq_cst);
          (in_RDI->super_BrokerBase).global_broker_id_local.gid = local_25c;
          bVar3 = std::atomic<bool>::load
                            ((atomic<bool> *)in_stack_fffffffffffff7f8,
                             (memory_order)((ulong)in_stack_fffffffffffff7f0 >> 0x20));
          (in_RDI->super_BrokerBase).field_0x294 = bVar3;
          pBVar9 = CLI::std::
                   unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                   ::operator->((unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                                 *)0x5f4a64);
          local_264 = (in_RDI->super_BrokerBase).global_broker_id_local.gid;
          GlobalFederateId::GlobalFederateId(&local_260,(GlobalBrokerId)local_264);
          BaseTimeCoordinator::setSourceId(pBVar9,local_260);
          (in_RDI->super_BrokerBase).field_0x295 = 1;
          bVar3 = std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::empty
                            ((vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>
                              *)in_stack_fffffffffffff800);
          if (bVar3) {
            return;
          }
          local_270 = &in_RDI->earlyMessages;
          local_278._M_current =
               (ActionMessage *)
               std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::begin
                         (in_stack_fffffffffffff7e8);
          local_280 = (ActionMessage *)
                      std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::
                      end((vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_> *)
                          in_stack_fffffffffffff7e8);
          while (bVar3 = __gnu_cxx::
                         operator==<helics::ActionMessage_*,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>_>
                                   ((__normal_iterator<helics::ActionMessage_*,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>_>
                                     *)in_stack_fffffffffffff7f0,
                                    (__normal_iterator<helics::ActionMessage_*,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>_>
                                     *)in_stack_fffffffffffff7e8), ((bVar3 ^ 0xffU) & 1) != 0) {
            local_288 = __gnu_cxx::
                        __normal_iterator<helics::ActionMessage_*,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>_>
                        ::operator*(&local_278);
            bVar3 = isPriorityCommand((ActionMessage *)0x5f4b4b);
            if (bVar3) {
              (*(in_RDI->super_Broker)._vptr_Broker[0x1e])(in_RDI,local_288);
            }
            else {
              (*(in_RDI->super_Broker)._vptr_Broker[0x1d])(in_RDI,local_288);
            }
            __gnu_cxx::
            __normal_iterator<helics::ActionMessage_*,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>_>
            ::operator++(&local_278);
          }
          std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::clear
                    ((vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_> *)
                     0x5f4bad);
          return;
        }
        GlobalFederateId::operator_cast_to_GlobalBrokerId
                  ((GlobalFederateId *)in_stack_fffffffffffff7e8);
        pBVar13 = getBrokerById((CoreBroker *)
                                CONCAT44(in_stack_fffffffffffff814.gid,in_stack_fffffffffffff810.gid
                                        ),in_stack_fffffffffffff81c);
        if (pBVar13 != (BasicBrokerInfo *)0x0) {
          pBVar13->state = DISCONNECTED;
        }
        CVar4 = getAllConnectionState
                          ((CoreBroker *)
                           CONCAT44(in_stack_fffffffffffff814.gid,in_stack_fffffffffffff810.gid));
        puVar17 = (undefined1 *)((ulong)(uint)in_stack_fffffffffffff80c << 0x20);
        if (CVar4 < DISCONNECTED) {
          return;
        }
        if (((in_RDI->super_BrokerBase).field_0x294 & 1) == 0) {
          puVar17 = local_640;
          ActionMessage::ActionMessage
                    ((ActionMessage *)
                     CONCAT44(in_stack_fffffffffffff814.gid,in_stack_fffffffffffff810.gid),
                     (action_t)((ulong)puVar17 >> 0x20));
          GlobalFederateId::GlobalFederateId
                    (&local_644,
                     (GlobalBrokerId)(in_RDI->super_BrokerBase).global_broker_id_local.gid);
          local_638 = local_644.gid;
          (*(in_RDI->super_Broker)._vptr_Broker[0x22])(in_RDI,0,puVar17);
          ActionMessage::~ActionMessage((ActionMessage *)in_stack_fffffffffffff7f0);
        }
        ActionMessage::ActionMessage
                  ((ActionMessage *)
                   CONCAT44(in_stack_fffffffffffff814.gid,in_stack_fffffffffffff810.gid),
                   (action_t)((ulong)puVar17 >> 0x20));
        BrokerBase::addActionMessage(in_stack_fffffffffffff7f0,in_stack_fffffffffffff7e8);
        ActionMessage::~ActionMessage((ActionMessage *)in_stack_fffffffffffff7f0);
        return;
      }
    }
  }
  processQueryCommand(in_stack_fffffffffffff880,in_stack_fffffffffffff878);
  return;
}

Assistant:

void CoreBroker::processPriorityCommand(ActionMessage&& command)
{
    // deal with a few types of message immediately
    LOG_TRACE(global_broker_id_local,
              getIdentifier(),
              fmt::format("|| priority_cmd:{} from {}",
                          prettyPrintString(command),
                          command.source_id.baseValue()));
    switch (command.action()) {
        case CMD_PING_PRIORITY:
            if (command.dest_id == global_broker_id_local) {
                ActionMessage pngrep(CMD_PING_REPLY);
                pngrep.dest_id = command.source_id;
                pngrep.source_id = global_broker_id_local;
                routeMessage(pngrep);
            } else {
                routeMessage(command);
            }
            break;
        case CMD_BROKER_SETUP: {
            global_broker_id_local = global_id.load();
            isRootc = _isRoot.load();
            timeCoord->setSourceId(global_broker_id_local);
            connectionEstablished = true;
            if (!earlyMessages.empty()) {
                for (auto& message : earlyMessages) {
                    if (isPriorityCommand(message)) {
                        processPriorityCommand(std::move(message));
                    } else {
                        processCommand(std::move(message));
                    }
                }
                earlyMessages.clear();
            }
            break;
        }
        case CMD_REG_FED:
            fedRegistration(std::move(command));
            break;
        case CMD_REG_BROKER:
            brokerRegistration(std::move(command));
            break;
        case CMD_FED_ACK: {  // we can't be root if we got one of these
            auto fed = mFederates.find(command.name());
            if (fed != mFederates.end()) {
                auto route = fed->route;
                if (!fed->global_id.isValid()) {
                    fed->global_id = command.dest_id;
                    mFederates.addSearchTerm(command.dest_id, fed->name);
                }
                transmit(route, command);
                routing_table.emplace(fed->global_id, route);
                if (enable_profiling) {
                    ActionMessage fedEnableProfiling(CMD_SET_PROFILER_FLAG,
                                                     global_broker_id_local,
                                                     command.dest_id);
                    setActionFlag(fedEnableProfiling, indicator_flag);
                    transmit(route, fedEnableProfiling);
                }
            } else {
                // this means we haven't seen this federate before for some reason
                mFederates.insert(command.name(), command.dest_id, command.name());
                mFederates.back().route = getRoute(command.source_id);
                mFederates.back().global_id = command.dest_id;
                routing_table.emplace(fed->global_id, mFederates.back().route);
                // it also means we don't forward it
            }

        } break;
        case CMD_BROKER_ACK: {  // we can't be root if we got one of these
            if (command.name() == identifier) {
                if (checkActionFlag(command, error_flag)) {
                    // generate an error message
                    LOG_ERROR(global_broker_id_local,
                              identifier,
                              fmt::format("unable to register broker {}",
                                          command.payload.to_string()));
                    return;
                }

                global_broker_id_local = command.dest_id;
                global_id.store(global_broker_id_local);
                higher_broker_id = command.source_id;
                if (checkActionFlag(command, global_timing_flag)) {
                    globalTime = true;
                    if (checkActionFlag(command, async_timing_flag)) {
                        asyncTime = true;
                    }
                }
                timeCoord->setSourceId(global_broker_id_local);
                transmitDelayedMessages();
                mBrokers.apply([localid = global_broker_id_local](auto& brk) {
                    if (!brk._nonLocal) {
                        brk.parent = localid;
                    }
                });

                timeoutMon->setParentId(higher_broker_id);
                if (checkActionFlag(command, slow_responding_flag)) {
                    timeoutMon->disableParentPing();
                }
                timeoutMon->reset();
                if (checkActionFlag(command, global_disconnect_flag)) {
                    globalDisconnect = true;
                }
                return;
            }
            auto broker = mBrokers.find(command.name());
            if (broker != mBrokers.end()) {
                if (broker->global_id == GlobalBrokerId{command.dest_id}) {
                    // drop the packet since we have seen this ack already
                    LOG_WARNING(global_broker_id_local, identifier, "repeated broker acks");
                    return;
                }
                broker->global_id = GlobalBrokerId{command.dest_id};
                auto route = broker->route;
                mBrokers.addSearchTerm(GlobalBrokerId{command.dest_id}, broker->name);
                routing_table.emplace(broker->global_id, route);
                command.source_id = global_broker_id_local;  // we want the intermediate broker to
                                                             // change the source_id
                transmit(route, command);
            } else {
                mBrokers.insert(command.name(), GlobalBrokerId{command.dest_id}, command.name());
                mBrokers.back().route = getRoute(command.source_id);
                mBrokers.back().global_id = GlobalBrokerId{command.dest_id};
                routing_table.emplace(broker->global_id, mBrokers.back().route);
            }
        } break;
        case CMD_PRIORITY_DISCONNECT: {
            auto* brk = getBrokerById(GlobalBrokerId{command.source_id});
            if (brk != nullptr) {
                brk->state = ConnectionState::DISCONNECTED;
            }
            if (getAllConnectionState() >= ConnectionState::DISCONNECTED) {
                if (!isRootc) {
                    ActionMessage dis(CMD_PRIORITY_DISCONNECT);
                    dis.source_id = global_broker_id_local;
                    transmit(parent_route_id, dis);
                }
                addActionMessage(CMD_STOP);
            }
        } break;
        case CMD_REG_ROUTE:
            break;
        case CMD_SEND_COMMAND:
            processCommandInstruction(command);
            break;
        case CMD_BROKER_QUERY:
        case CMD_QUERY:
        case CMD_QUERY_REPLY:
        case CMD_SET_GLOBAL:
            processQueryCommand(command);
            break;

        default:
            // must not have been a priority command
            break;
    }
}